

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmx-impl.inc.c
# Opt level: O1

void gen_vmladduhm(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *s;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGTemp *ts_01;
  TCGTemp *ts_02;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  if (ctx->altivec_enabled != false) {
    s = ctx->uc->tcg_ctx;
    uVar1 = ctx->opcode;
    ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    tcg_gen_addi_i64_ppc64
              (s,(TCGv_i64)((long)ts - (long)s),(TCGv_i64)s->cpu_env,
               (ulong)(uVar1 >> 0xc & 0x1f0) + 0x12d20);
    uVar1 = ctx->opcode;
    ts_00 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    tcg_gen_addi_i64_ppc64
              (s,(TCGv_i64)((long)ts_00 - (long)s),(TCGv_i64)s->cpu_env,
               (ulong)(uVar1 >> 7 & 0x1f0) + 0x12d20);
    uVar1 = ctx->opcode;
    ts_01 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    tcg_gen_addi_i64_ppc64
              (s,(TCGv_i64)((long)ts_01 - (long)s),(TCGv_i64)s->cpu_env,
               (ulong)(uVar1 >> 2 & 0x1f0) + 0x12d20);
    uVar1 = ctx->opcode;
    ts_02 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    tcg_gen_addi_i64_ppc64
              (s,(TCGv_i64)((long)ts_02 - (long)s),(TCGv_i64)s->cpu_env,
               (ulong)(uVar1 >> 0x11 & 0x1f0) + 0x12d20);
    local_58 = ts_02;
    local_50 = ts;
    local_48 = ts_00;
    local_40 = ts_01;
    tcg_gen_callN_ppc64(s,helper_vmladduhm_ppc64,(TCGTemp *)0x0,4,&local_58);
    tcg_temp_free_internal_ppc64(s,ts);
    tcg_temp_free_internal_ppc64(s,ts_00);
    tcg_temp_free_internal_ppc64(s,ts_01);
    tcg_temp_free_internal_ppc64(s,ts_02);
    return;
  }
  gen_exception(ctx,0x49);
  return;
}

Assistant:

static void gen_vmladduhm(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_ptr ra, rb, rc, rd;
    if (unlikely(!ctx->altivec_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VPU);
        return;
    }
    ra = gen_avr_ptr(tcg_ctx, rA(ctx->opcode));
    rb = gen_avr_ptr(tcg_ctx, rB(ctx->opcode));
    rc = gen_avr_ptr(tcg_ctx, rC(ctx->opcode));
    rd = gen_avr_ptr(tcg_ctx, rD(ctx->opcode));
    gen_helper_vmladduhm(tcg_ctx, rd, ra, rb, rc);
    tcg_temp_free_ptr(tcg_ctx, ra);
    tcg_temp_free_ptr(tcg_ctx, rb);
    tcg_temp_free_ptr(tcg_ctx, rc);
    tcg_temp_free_ptr(tcg_ctx, rd);
}